

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

_Bool extent_merge_impl(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t *a,edata_t *b,
                       _Bool holding_core_locks)

{
  ulong uVar1;
  ulong uVar2;
  extent_hooks_t *peVar3;
  _Bool _Var4;
  ulong uVar5;
  void *addr_b;
  void *addr_a;
  emap_prepare_t prepare;
  emap_prepare_t local_50;
  
  addr_a = (void *)((ulong)a->e_addr & 0xfffffffffffff000);
  uVar1 = (a->field_2).e_size_esn;
  addr_b = (void *)((ulong)b->e_addr & 0xfffffffffffff000);
  uVar5 = (b->field_2).e_size_esn;
  uVar2 = a->e_bits;
  peVar3 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar3 == &duckdb_je_ehooks_default_extent_hooks) {
    _Var4 = duckdb_je_ehooks_default_merge_impl(tsdn,addr_a,addr_b);
    if (_Var4) {
      return true;
    }
  }
  else {
    if (peVar3->merge == (extent_merge_t *)0x0) {
      return true;
    }
    ehooks_pre_reentrancy(tsdn);
    _Var4 = (*peVar3->merge)(peVar3,addr_a,uVar1 & 0xfffffffffffff000,addr_b,
                             uVar5 & 0xfffffffffffff000,(_Bool)((byte)(uVar2 >> 0xd) & 1),
                             ehooks->ind);
    ehooks_post_reentrancy(tsdn);
    if (_Var4) {
      return true;
    }
  }
  duckdb_je_emap_merge_prepare(tsdn,pac->emap,&local_50,a,b);
  uVar1 = a->e_bits;
  a->e_bits = uVar1 & 0xfffffffffff1ffff;
  (a->field_2).e_size_esn =
       (ulong)((uint)(a->field_2).e_size_esn & 0xfff) |
       ((b->field_2).e_size_esn & 0xfffffffffffff000) +
       ((a->field_2).e_size_esn & 0xfffffffffffff000);
  uVar5 = b->e_sn;
  if (a->e_sn < b->e_sn) {
    uVar5 = a->e_sn;
  }
  a->e_sn = uVar5;
  if ((short)uVar1 < 0) {
    uVar5 = (ulong)((uint)b->e_bits & 0x8000);
  }
  else {
    uVar5 = 0;
  }
  a->e_bits = uVar1 & 0xfffffffffff17fff | uVar5;
  duckdb_je_emap_merge_commit(tsdn,pac->emap,&local_50,a,b);
  duckdb_je_edata_cache_put(tsdn,pac->edata_cache,b);
  return false;
}

Assistant:

static bool
extent_merge_impl(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, edata_t *a,
    edata_t *b, bool holding_core_locks) {
	/* Only the expanding path may merge w/o holding ecache locks. */
	if (holding_core_locks) {
		witness_assert_positive_depth_to_rank(
		    tsdn_witness_tsdp_get(tsdn), WITNESS_RANK_CORE);
	} else {
		witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
		    WITNESS_RANK_CORE, 0);
	}

	assert(edata_base_get(a) < edata_base_get(b));
	assert(edata_arena_ind_get(a) == edata_arena_ind_get(b));
	assert(edata_arena_ind_get(a) == ehooks_ind_get(ehooks));
	emap_assert_mapped(tsdn, pac->emap, a);
	emap_assert_mapped(tsdn, pac->emap, b);

	bool err = ehooks_merge(tsdn, ehooks, edata_base_get(a),
	    edata_size_get(a), edata_base_get(b), edata_size_get(b),
	    edata_committed_get(a));

	if (err) {
		return true;
	}

	/*
	 * The rtree writes must happen while all the relevant elements are
	 * owned, so the following code uses decomposed helper functions rather
	 * than extent_{,de}register() to do things in the right order.
	 */
	emap_prepare_t prepare;
	emap_merge_prepare(tsdn, pac->emap, &prepare, a, b);

	assert(edata_state_get(a) == extent_state_active ||
	    edata_state_get(a) == extent_state_merging);
	edata_state_set(a, extent_state_active);
	edata_size_set(a, edata_size_get(a) + edata_size_get(b));
	edata_sn_set(a, (edata_sn_get(a) < edata_sn_get(b)) ?
	    edata_sn_get(a) : edata_sn_get(b));
	edata_zeroed_set(a, edata_zeroed_get(a) && edata_zeroed_get(b));

	emap_merge_commit(tsdn, pac->emap, &prepare, a, b);

	edata_cache_put(tsdn, pac->edata_cache, b);

	return false;
}